

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O3

bool doVisit<(arangodb::velocypack::Collection::VisitationOrder)2>
               (Slice slice,
               function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *func)

{
  ValueType VVar1;
  bool bVar2;
  Slice SVar3;
  Exception *this;
  ObjectPair OVar4;
  ObjectIterator it;
  Slice local_60;
  Slice local_58;
  ObjectIterator local_50;
  
  if (arangodb::velocypack::SliceStaticData::TypeMap[*slice._start] == Array) {
    arangodb::velocypack::ArrayIterator::ArrayIterator((ArrayIterator *)&local_50,slice);
    if (local_50._position == local_50._size) {
      return true;
    }
    do {
      SVar3 = arangodb::velocypack::ArrayIterator::value((ArrayIterator *)&local_50);
      VVar1 = arangodb::velocypack::SliceStaticData::TypeMap[*SVar3._start];
      local_58._start = "";
      OVar4.value._start = SVar3._start;
      OVar4.key._start = "";
      if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00109e37;
      local_60 = SVar3;
      bVar2 = (*func->_M_invoker)((_Any_data *)func,&local_58,&local_60);
      if (!bVar2) {
        return false;
      }
      if (((VVar1 & ~Illegal) == Array) &&
         (bVar2 = doVisit<(arangodb::velocypack::Collection::VisitationOrder)2>(SVar3,func), !bVar2)
         ) {
        return false;
      }
      arangodb::velocypack::ArrayIterator::next((ArrayIterator *)&local_50);
    } while (local_50._position != local_50._size);
  }
  else {
    if (arangodb::velocypack::SliceStaticData::TypeMap[*slice._start] != Object) {
      this = (Exception *)__cxa_allocate_exception(0x18);
      arangodb::velocypack::Exception::Exception
                (this,InvalidValueType,"Expecting type Object or Array");
      __cxa_throw(this,&arangodb::velocypack::Exception::typeinfo,
                  arangodb::velocypack::Exception::~Exception);
    }
    arangodb::velocypack::ObjectIterator::ObjectIterator(&local_50,slice,false);
    if (local_50._position == local_50._size) {
      return true;
    }
    do {
      OVar4 = arangodb::velocypack::ObjectIterator::operator*(&local_50);
      SVar3 = OVar4.value._start;
      local_58 = OVar4.key._start;
      VVar1 = arangodb::velocypack::SliceStaticData::TypeMap[*SVar3._start];
      if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_00109e37:
        local_60 = OVar4.value._start;
        local_58 = OVar4.key._start;
        std::__throw_bad_function_call();
      }
      local_60._start = SVar3._start;
      bVar2 = (*func->_M_invoker)((_Any_data *)func,&local_58,&local_60);
      if ((!bVar2) ||
         (((VVar1 & ~Illegal) == Array &&
          (bVar2 = doVisit<(arangodb::velocypack::Collection::VisitationOrder)2>(SVar3,func), !bVar2
          )))) {
        return false;
      }
      arangodb::velocypack::ObjectIterator::next(&local_50);
    } while (local_50._position != local_50._size);
  }
  return true;
}

Assistant:

static bool doVisit(
    Slice slice,
    std::function<bool(Slice key, Slice value)> const& func) {
  if (slice.isObject()) {
    return visitObject<order>(slice, func);
  }
  if (slice.isArray()) {
    return visitArray<order>(slice, func);
  }

  throw Exception(Exception::InvalidValueType,
                  "Expecting type Object or Array");
}